

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::(anonymous_namespace)::BasicDispatchIndirect::Purpose_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "\n1. Verify that DispatchComputeIndirect command works as described in the OpenGL specification.\n2. Verify that <offset> parameter is correctly applied.\n3. Verify that updating dispatch buffer with different methods (BufferData, BufferSubData, MapBuffer)\n    just before DispatchComputeIndirect call works as expected.\n4. Verify that GL_DISPATCH_INDIRECT_BUFFER_BINDING binding point is set correctly."
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Purpose()
	{
		return NL
			"1. Verify that DispatchComputeIndirect command works as described in the OpenGL specification." NL
			"2. Verify that <offset> parameter is correctly applied." NL
			"3. Verify that updating dispatch buffer with different methods (BufferData, BufferSubData, MapBuffer)" NL
			"    just before DispatchComputeIndirect call works as expected." NL
			"4. Verify that GL_DISPATCH_INDIRECT_BUFFER_BINDING binding point is set correctly.";
	}